

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.c
# Opt level: O1

void zSetRWork(int m,int panel_size,doublecomplex *dworkptr,doublecomplex **dense,
              doublecomplex **tempv)

{
  int iVar1;
  int iVar2;
  
  iVar1 = sp_ienv(3);
  iVar2 = sp_ienv(7);
  iVar1 = sp_ienv((uint)(iVar1 <= iVar2) * 4 + 3);
  iVar2 = sp_ienv(4);
  *dense = dworkptr;
  *tempv = dworkptr + panel_size * m;
  zfill(*dense,panel_size * m,(doublecomplex)ZEXT816(0));
  iVar1 = (iVar2 + iVar1) * panel_size;
  if (iVar1 <= m) {
    iVar1 = m;
  }
  zfill(*tempv,iVar1,(doublecomplex)ZEXT816(0));
  return;
}

Assistant:

void
zSetRWork(int m, int panel_size, doublecomplex *dworkptr,
	 doublecomplex **dense, doublecomplex **tempv)
{
    doublecomplex zero = {0.0, 0.0};

    int maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
        rowblk   = sp_ienv(4);
    *dense = dworkptr;
    *tempv = *dense + panel_size*m;
    zfill (*dense, m * panel_size, zero);
    zfill (*tempv, NUM_TEMPV(m,panel_size,maxsuper,rowblk), zero);     
}